

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O0

void __thiscall
slang::syntax::ClockingDeclarationSyntax::ClockingDeclarationSyntax
          (ClockingDeclarationSyntax *this,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,Token globalOrDefault,
          Token clocking,Token blockName,Token at,EventExpressionSyntax *event,Token semi,
          SyntaxList<slang::syntax::MemberSyntax> *items,Token endClocking,
          NamedBlockClauseSyntax *endBlockName)

{
  undefined4 uVar1;
  bool bVar2;
  EventExpressionSyntax *pEVar3;
  reference ppMVar4;
  size_t in_RCX;
  SyntaxNode *in_RDX;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_RDI;
  pointer in_R8;
  size_t in_R9;
  EventExpressionSyntax *in_stack_00000028;
  MemberSyntax *child;
  iterator __end2;
  iterator __begin2;
  SyntaxList<slang::syntax::MemberSyntax> *__range2;
  SyntaxNode *in_stack_00000050;
  SyntaxList<slang::syntax::MemberSyntax> *in_stack_ffffffffffffff78;
  SyntaxList<slang::syntax::MemberSyntax> *this_00;
  span<slang::syntax::MemberSyntax_*,_18446744073709551615UL> *this_01;
  undefined8 in_stack_ffffffffffffffa8;
  MemberSyntax *in_stack_ffffffffffffffb0;
  __normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
  local_48;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *local_40;
  EventExpressionSyntax *local_38 [3];
  pointer local_20;
  size_t local_18;
  SyntaxNode *local_10;
  size_t local_8;
  
  this_01 = (span<slang::syntax::MemberSyntax_*,_18446744073709551615UL> *)&stack0x00000018;
  this_00 = (SyntaxList<slang::syntax::MemberSyntax> *)&stack0x00000008;
  local_20 = in_R8;
  local_18 = in_R9;
  local_10 = in_RDX;
  local_8 = in_RCX;
  MemberSyntax::MemberSyntax
            (in_stack_ffffffffffffffb0,(SyntaxKind)((ulong)in_stack_ffffffffffffffa8 >> 0x20),in_RDI
            );
  in_RDI[1].super_SyntaxListBase.super_SyntaxNode.previewNode = local_10;
  in_RDI[1].super_SyntaxListBase.childCount = local_8;
  in_RDI[1].super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       local_20;
  in_RDI[1].super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = local_18;
  in_RDI[2].super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)(this_00->super_SyntaxListBase)._vptr_SyntaxListBase;
  uVar1 = *(undefined4 *)&(this_00->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  in_RDI[2].super_SyntaxListBase.super_SyntaxNode.kind =
       (this_00->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&in_RDI[2].super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar1;
  in_RDI[2].super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this_01->_M_ptr;
  in_RDI[2].super_SyntaxListBase.super_SyntaxNode.previewNode =
       (SyntaxNode *)(this_01->_M_extent)._M_extent_value;
  local_38[0] = in_stack_00000028;
  not_null<slang::syntax::EventExpressionSyntax_*>::not_null<slang::syntax::EventExpressionSyntax_*>
            ((not_null<slang::syntax::EventExpressionSyntax_*> *)
             &in_RDI[2].super_SyntaxListBase.childCount,local_38);
  in_RDI[2].super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       (pointer)child;
  in_RDI[2].super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = (size_t)__end2._M_current;
  SyntaxList<slang::syntax::MemberSyntax>::SyntaxList(this_00,in_stack_ffffffffffffff78);
  in_RDI[4].super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)__range2;
  *(SyntaxNode **)&in_RDI[4].super_SyntaxListBase.super_SyntaxNode = in_stack_00000050;
  in_RDI[4].super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)attributes;
  pEVar3 = not_null<slang::syntax::EventExpressionSyntax_*>::operator->
                     ((not_null<slang::syntax::EventExpressionSyntax_*> *)0x28b542);
  (pEVar3->super_SequenceExprSyntax).super_SyntaxNode.parent = (SyntaxNode *)in_RDI;
  in_RDI[3].super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)in_RDI;
  local_40 = in_RDI + 3;
  local_48._M_current =
       (MemberSyntax **)
       std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>::begin
                 ((span<slang::syntax::MemberSyntax_*,_18446744073709551615UL> *)
                  in_stack_ffffffffffffff78);
  std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>::end(this_01);
  while( true ) {
    bVar2 = __gnu_cxx::
            operator==<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
                      ((__normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
                        *)this_00,
                       (__normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffff78);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    ppMVar4 = __gnu_cxx::
              __normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
              ::operator*(&local_48);
    ((*ppMVar4)->super_SyntaxNode).parent = (SyntaxNode *)in_RDI;
    __gnu_cxx::
    __normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
    ::operator++(&local_48);
  }
  if (in_RDI[4].super_SyntaxListBase.super_SyntaxNode.parent != (SyntaxNode *)0x0) {
    (in_RDI[4].super_SyntaxListBase.super_SyntaxNode.parent)->parent = (SyntaxNode *)in_RDI;
  }
  return;
}

Assistant:

ClockingDeclarationSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, Token globalOrDefault, Token clocking, Token blockName, Token at, EventExpressionSyntax& event, Token semi, const SyntaxList<MemberSyntax>& items, Token endClocking, NamedBlockClauseSyntax* endBlockName) :
        MemberSyntax(SyntaxKind::ClockingDeclaration, attributes), globalOrDefault(globalOrDefault), clocking(clocking), blockName(blockName), at(at), event(&event), semi(semi), items(items), endClocking(endClocking), endBlockName(endBlockName) {
        this->event->parent = this;
        this->items.parent = this;
        for (auto child : this->items)
            child->parent = this;
        if (this->endBlockName) this->endBlockName->parent = this;
    }